

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O2

vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> * __thiscall
dg::dda::MemorySSATransformation::findDefinitionsInPredecessors
          (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *__return_storage_ptr__,
          MemorySSATransformation *this,RWBBlock *block,DefSite *ds)

{
  pointer ppRVar1;
  RWBBlock *block_00;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> pdefs;
  _Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> local_28;
  
  (__return_storage_ptr__->super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppRVar1 = *(pointer *)
             ((long)&(block->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                     super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                     _predecessors.
                     super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                     _M_impl.super__Vector_impl_data + 8);
  if (((long)ppRVar1 -
       (long)(block->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
             super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
             _predecessors.
             super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
             super__Vector_impl_data._M_start == 8) &&
     (block_00 = ppRVar1[-1], block_00 != (RWBBlock *)0x0)) {
    findDefinitions((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)&local_28,this,
                    block_00,ds);
    std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
    insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode**,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>,void>
              ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                )local_28._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                )local_28._M_impl.super__Vector_impl_data._M_finish);
    std::_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~_Vector_base
              (&local_28);
  }
  else {
    findDefinitionsInMultiplePredecessors(this,block,ds,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RWNode *>
MemorySSATransformation::findDefinitionsInPredecessors(RWBBlock *block,
                                                       const DefSite &ds) {
    assert(block);
    assert(ds.target && "Target is null");
    assert(!ds.target->isUnknown() &&
           "Finding uknown memory"); // this is handled differently

    std::vector<RWNode *> defs;

    // if we have a unique predecessor,
    // we can find the definitions there and continue searching in the
    // predecessor if something is missing
    if (auto *pred = block->getSinglePredecessor()) {
        auto pdefs = findDefinitions(pred, ds);
#ifndef NDEBUG
        auto &D = getBBlockDefinitions(pred, &ds);
        assert((!pdefs.empty() || D.unknownWrites.empty()) &&
               "BUG: if we found no definitions, also unknown writes must be "
               "empty");
#endif // not NDEBUG
        defs.insert(defs.end(), pdefs.begin(), pdefs.end());
    } else { // multiple or no predecessors
        findDefinitionsInMultiplePredecessors(block, ds, defs);
    }

    return defs;
}